

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int subjRequiresPage(PgHdr *pPg)

{
  uint i;
  PagerSavepoint *pPVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)pPg->pPager->nSavepoint;
  if (0 < lVar3) {
    i = pPg->pgno;
    pPVar1 = pPg->pPager->aSavepoint;
    lVar4 = 0;
    do {
      if ((i <= *(uint *)((long)pPVar1->aWalData + lVar4 + -8)) &&
         (iVar2 = sqlite3BitvecTest(*(Bitvec **)((long)pPVar1->aWalData + lVar4 + -0x10),i),
         iVar2 == 0)) {
        return 1;
      }
      lVar4 = lVar4 + 0x30;
    } while (lVar3 * 0x30 != lVar4);
  }
  return 0;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pgno pgno = pPg->pgno;
  Pager *pPager = pPg->pPager;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    PagerSavepoint *p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTest(p->pInSavepoint, pgno) ){
      return 1;
    }
  }
  return 0;
}